

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

TextureLevelPyramid * __thiscall
tcu::TextureLevelPyramid::operator=(TextureLevelPyramid *this,TextureLevelPyramid *other)

{
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *this_00;
  TextureFormat *pTVar1;
  undefined8 *puVar2;
  pointer pPVar3;
  pointer pAVar4;
  long lVar5;
  int levelNdx;
  long lVar6;
  long lVar7;
  undefined1 local_58 [24];
  int aiStack_40 [2];
  void *local_38;
  
  if (this != other) {
    this->m_format = other->m_format;
    this_00 = &this->m_data;
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize(this_00,(long)(int)(((long)(other->m_access).
                                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(other->m_access).
                                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x28));
    std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
              (&this->m_access,
               (long)(int)(((long)(other->m_access).
                                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(other->m_access).
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x28));
    lVar5 = 0;
    lVar7 = 0;
    lVar6 = 0;
    while( true ) {
      pPVar3 = (other->m_access).
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((int)(((long)(other->m_access).
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x28) <= lVar6)
      break;
      pAVar4 = (other->m_data).
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&pAVar4->m_cap + lVar7) == 0) {
        if (*(long *)((long)&((this_00->
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_cap + lVar7) != 0) {
          clearLevel(this,(int)lVar6);
        }
      }
      else {
        de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
                  ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)
                   ((long)&((this_00->
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7),
                   (ArrayBuffer<unsigned_char,_1UL,_1UL> *)((long)&pAVar4->m_ptr + lVar7));
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_58,
                   (TextureFormat *)
                   ((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar5 + -8),
                   *(int *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar5),
                   *(int *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar5 + 4U)
                   ,*(int *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar5 + 8U
                            ),
                   *(void **)((long)&((this_00->
                                      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7));
        pPVar3 = (this->m_access).
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(void **)((long)(&(pPVar3->super_ConstPixelBufferAccess).m_pitch + 1) + lVar5) = local_38;
        puVar2 = (undefined8 *)
                 ((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar5 + 8U);
        *puVar2 = local_58._16_8_;
        puVar2[1] = aiStack_40;
        pTVar1 = (TextureFormat *)
                 ((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar5 + -8);
        pTVar1->order = local_58._0_4_;
        pTVar1->type = local_58._4_4_;
        pTVar1[1].order = local_58._8_4_;
        pTVar1[1].type = local_58._12_4_;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
      lVar5 = lVar5 + 0x28;
    }
  }
  return this;
}

Assistant:

TextureLevelPyramid& TextureLevelPyramid::operator= (const TextureLevelPyramid& other)
{
	if (this == &other)
		return *this;

	m_format = other.m_format;
	m_data.resize(other.getNumLevels());
	m_access.resize(other.getNumLevels());

	for (int levelNdx = 0; levelNdx < other.getNumLevels(); levelNdx++)
	{
		if (!other.isLevelEmpty(levelNdx))
		{
			const tcu::ConstPixelBufferAccess& srcLevel = other.getLevel(levelNdx);

			m_data[levelNdx] = other.m_data[levelNdx];
			m_access[levelNdx] = PixelBufferAccess(srcLevel.getFormat(), srcLevel.getWidth(), srcLevel.getHeight(), srcLevel.getDepth(), m_data[levelNdx].getPtr());
		}
		else if (!isLevelEmpty(levelNdx))
			clearLevel(levelNdx);
	}

	return *this;
}